

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O3

int bundle_remove_conn(connectbundle *bundle,connectdata *conn)

{
  int in_EAX;
  int extraout_EAX;
  Curl_llist_element *e;
  
  e = (bundle->conn_list).head;
  if (e != (Curl_llist_element *)0x0) {
    do {
      if ((connectdata *)e->ptr == conn) {
        Curl_llist_remove(&bundle->conn_list,e,(void *)0x0);
        bundle->num_connections = bundle->num_connections - 1;
        conn->bundle = (connectbundle *)0x0;
        return extraout_EAX;
      }
      e = e->next;
    } while (e != (Curl_llist_element *)0x0);
  }
  return in_EAX;
}

Assistant:

static int bundle_remove_conn(struct connectbundle *bundle,
                              struct connectdata *conn)
{
  struct Curl_llist_element *curr;

  curr = bundle->conn_list.head;
  while(curr) {
    if(curr->ptr == conn) {
      Curl_llist_remove(&bundle->conn_list, curr, NULL);
      bundle->num_connections--;
      conn->bundle = NULL;
      return 1; /* we removed a handle */
    }
    curr = curr->next;
  }
  DEBUGASSERT(0);
  return 0;
}